

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChChaseCamera::ChChaseCamera(ChChaseCamera *this,shared_ptr<chrono::ChBody> *chassis)

{
  undefined1 auVar1 [32];
  ChVector<double> local_98;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChCoordsys<double> local_48;
  
  this->m_state = Chase;
  (this->m_up).m_data[0] = 0.0;
  (this->m_up).m_data[1] = 0.0;
  (this->m_up).m_data[2] = 0.0;
  (this->m_fwd).m_data[0] = 0.0;
  (this->m_up).m_data[2] = 0.0;
  (this->m_fwd).m_data[0] = 0.0;
  (this->m_fwd).m_data[1] = 0.0;
  (this->m_fwd).m_data[2] = 0.0;
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,
             &chassis->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])((this->m_ptOnChassis).m_data + 2) = auVar1;
  this->m_ptOnChassis = (ChVector<double>)auVar1._0_24_;
  (this->m_driverCsys).pos.m_data[0] = (double)auVar1._24_8_;
  (this->m_driverCsys).rot.m_data[0] = 1.0;
  (this->m_driverCsys).rot.m_data[1] = 0.0;
  (this->m_driverCsys).rot.m_data[2] = 0.0;
  (this->m_driverCsys).rot.m_data[3] = 0.0;
  this->m_mult = 1.0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->m_loc = (ChVector<double>)auVar1._0_24_;
  (this->m_lastLoc).m_data[0] = (double)auVar1._24_8_;
  *(undefined1 (*) [32])((this->m_loc).m_data + 2) = auVar1;
  this->m_horizGain = 4.0;
  this->m_vertGain = 2.0;
  this->m_minMult = 0.5;
  this->m_maxMult = 10.0;
  local_78.m_data[2] = 0.0;
  local_48.pos.m_data[0] = 0.0;
  local_48.pos.m_data[1] = 0.0;
  local_48.pos.m_data[2] = 0.0;
  local_48.rot.m_data[0] = 1.0;
  local_48.rot.m_data[3] = 0.0;
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_60.m_data[0] = 1.0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_48.rot.m_data[1] = 0.0;
  local_48.rot.m_data[2] = 0.0;
  local_98.m_data[2] = 1.0;
  local_60.m_data[1] = 0.0;
  local_60.m_data[2] = 0.0;
  Initialize(this,&local_78,&local_48,5.0,1.0,&local_98,&local_60);
  return;
}

Assistant:

ChChaseCamera::ChChaseCamera(std::shared_ptr<ChBody> chassis)
    : m_chassis(chassis),
      m_mult(1),
      m_maxMult(10),
      m_minMult(0.5f),
      m_horizGain(4.0f),
      m_vertGain(2.0f),
      m_state(Chase) {
    Initialize(ChVector<>(0, 0, 0), ChCoordsys<>(), 5, 1);
}